

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncateForPacking
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literal *value
          ,Field *field)

{
  bool bVar1;
  Literal local_70;
  Literal local_48;
  uint local_30;
  BasicType local_2c;
  int32_t c;
  Field *field_local;
  Literal *value_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  local_2c = i32;
  _c = field;
  field_local = (Field *)value;
  value_local = (Literal *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  bVar1 = Type::operator==((Type *)field,&local_2c);
  if (bVar1) {
    local_30 = wasm::Literal::geti32(value);
    if (*(int *)(_c + 8) == 1) {
      wasm::Literal::Literal(&local_48,local_30 & 0xff);
      ::wasm::Literal::operator=(value,&local_48);
      ::wasm::Literal::~Literal(&local_48);
    }
    else if (*(int *)(_c + 8) == 2) {
      wasm::Literal::Literal(&local_70,local_30 & 0xffff);
      ::wasm::Literal::operator=(value,&local_70);
      ::wasm::Literal::~Literal(&local_70);
    }
  }
  ::wasm::Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal truncateForPacking(Literal value, const Field& field) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        value = Literal(c & 0xff);
      } else if (field.packedType == Field::i16) {
        value = Literal(c & 0xffff);
      }
    }
    return value;
  }